

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O2

void __thiscall
AnaylserUnits_compoundEquivalentUnitsMismatch_Test::TestBody
          (AnaylserUnits_compoundEquivalentUnitsMismatch_Test *this)

{
  StandardUnit SVar1;
  element_type *peVar2;
  char *pcVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AnalyserPtr analyser;
  ScopedTrace gtest_trace_756;
  AssertionResult gtest_ar;
  unsigned_long local_a8;
  UnitsPtr apple;
  UnitsPtr orange;
  ComponentPtr c;
  ModelPtr m;
  UnitsPtr gas;
  VariablePtr o;
  VariablePtr a;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,
             "The units in \'a = o\' in component \'main\' are not equivalent. \'a\' is in \'apple\' (i.e. \'kilogram x metre^2 x second^-2\') while \'o\' is in \'orange\' (i.e. \'ampere^-2 x kilogram x metre^5 x second^-3\')."
             ,(allocator<char> *)&m);
  __l._M_len = 1;
  __l._M_array = (iterator)&analyser;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,(allocator_type *)&c);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"compound_units",(allocator<char> *)&c);
  libcellml::Model::create((string *)&m);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"main",(allocator<char> *)&a);
  libcellml::Component::create((string *)&c);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::string<std::allocator<char>>((string *)&analyser,"a",(allocator<char> *)&o);
  libcellml::Variable::create((string *)&a);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"o",(allocator<char> *)&gas);
  libcellml::Variable::create((string *)&o);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"gas_constant",(allocator<char> *)&apple);
  libcellml::Units::create((string *)&gas);
  std::__cxx11::string::~string((string *)&analyser);
  SVar1 = (StandardUnit)gas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"",(allocator<char> *)&apple);
  libcellml::Units::addUnit(SVar1,-1.0,(string *)0xc);
  std::__cxx11::string::~string((string *)&analyser);
  SVar1 = (StandardUnit)gas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"",(allocator<char> *)&apple);
  libcellml::Units::addUnit(SVar1,3.0,(string *)0x11);
  std::__cxx11::string::~string((string *)&analyser);
  SVar1 = (StandardUnit)gas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"",(allocator<char> *)&apple);
  libcellml::Units::addUnit(SVar1,-1.0,(string *)0x12);
  std::__cxx11::string::~string((string *)&analyser);
  libcellml::Units::addUnit
            ((StandardUnit)
             gas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"apple",(allocator<char> *)&orange);
  libcellml::Units::create((string *)&apple);
  std::__cxx11::string::~string((string *)&analyser);
  SVar1 = (StandardUnit)
          apple.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar3 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"",(allocator<char> *)&orange);
  libcellml::Units::addUnit(SVar1,3.0,(string *)0x11);
  std::__cxx11::string::~string((string *)&analyser);
  libcellml::Units::addUnit
            ((StandardUnit)
             apple.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"orange",(allocator<char> *)&gtest_ar);
  libcellml::Units::create((string *)&orange);
  std::__cxx11::string::~string((string *)&analyser);
  peVar2 = orange.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"gas_constant",(allocator<char> *)&gtest_ar);
  libcellml::Units::addUnit((string *)peVar2);
  std::__cxx11::string::~string((string *)&analyser);
  libcellml::Units::addUnit
            ((StandardUnit)
             orange.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Units::addUnit
            ((StandardUnit)
             orange.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             a.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setUnits
            ((shared_ptr *)
             o.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInitialValue(3.5);
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Model::addUnits
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">  <apply>    <eq/>    <ci>a</ci>    <ci>o</ci>  </apply></math>"
             ,(allocator<char> *)&gtest_ar);
  libcellml::Component::setMath
            ((string *)c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)&analyser);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  _gtest_trace_756 = 1;
  local_a8 = libcellml::Logger::warningCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(1)","analyser->warningCount()",
             (unsigned_long *)&gtest_trace_756,&local_a8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_trace_756);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x2f3,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_a8,(Message *)&gtest_trace_756);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_trace_756);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_756,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x2f4,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Analyser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar,
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_756);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&orange.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&apple.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&gas.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&o.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&a.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  return;
}

Assistant:

TEST(AnaylserUnits, compoundEquivalentUnitsMismatch)
{
    const std::vector<std::string> expectedIssues = {
        "The units in 'a = o' in component 'main' are not equivalent. 'a' is in 'apple' (i.e. 'kilogram x metre^2 x second^-2') while 'o' is in 'orange' (i.e. 'ampere^-2 x kilogram x metre^5 x second^-3').",
    };

    auto m = libcellml::Model::create("compound_units");
    auto c = libcellml::Component::create("main");
    auto a = libcellml::Variable::create("a");
    auto o = libcellml::Variable::create("o");

    auto gas = libcellml::Units::create("gas_constant");
    gas->addUnit(libcellml::Units::StandardUnit::KELVIN, -1.0);
    gas->addUnit(libcellml::Units::StandardUnit::METRE, 3.0);
    gas->addUnit(libcellml::Units::StandardUnit::MOLE, -1.0);
    gas->addUnit(libcellml::Units::StandardUnit::OHM);

    auto apple = libcellml::Units::create("apple");
    apple->addUnit(libcellml::Units::StandardUnit::METRE, 3.0);
    apple->addUnit(libcellml::Units::StandardUnit::PASCAL);

    auto orange = libcellml::Units::create("orange");
    orange->addUnit("gas_constant");
    orange->addUnit(libcellml::Units::StandardUnit::KELVIN);
    orange->addUnit(libcellml::Units::StandardUnit::MOLE);

    c->addVariable(a);
    a->setUnits(apple);

    c->addVariable(o);
    o->setUnits(orange);
    o->setInitialValue(3.5);

    m->addUnits(apple);
    m->addUnits(orange);
    m->addUnits(gas);

    m->addComponent(c);

    c->setMath(
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">"
        "  <apply>"
        "    <eq/>"
        "    <ci>a</ci>"
        "    <ci>o</ci>"
        "  </apply>"
        "</math>");

    auto analyser = libcellml::Analyser::create();
    analyser->analyseModel(m);

    EXPECT_EQ(size_t(1), analyser->warningCount());
    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}